

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lista_tests.cpp
# Opt level: O0

void __thiscall
lista_test_test_agregar_varios_elementos_solo_adelante_Test::
~lista_test_test_agregar_varios_elementos_solo_adelante_Test
          (lista_test_test_agregar_varios_elementos_solo_adelante_Test *this)

{
  lista_test_test_agregar_varios_elementos_solo_adelante_Test *this_local;
  
  ~lista_test_test_agregar_varios_elementos_solo_adelante_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(lista_test, test_agregar_varios_elementos_solo_adelante) {
    Lista<int> l;
    l.agregarAdelante(42);
    l.agregarAdelante(41);
    l.agregarAdelante(40);
    l.agregarAdelante(39);
    ASSERT_EQ(l.longitud(), 4);
    ASSERT_EQ(l.iesimo(0), 39);
    ASSERT_EQ(l.iesimo(1), 40);
    ASSERT_EQ(l.iesimo(2), 41);
    ASSERT_EQ(l.iesimo(3), 42);
}